

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

string * deqp::gls::BuiltinPrecisionTests::Functions::vecName<float,4>(void)

{
  size_type *psVar1;
  undefined8 uVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  string *in_RDI;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0;
  long lStack_1d8;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  local_1a8 = 0;
  local_1a0 = 0;
  local_1b0 = &local_1a0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_1e0 = *puVar5;
    lStack_1d8 = plVar3[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *puVar5;
    local_1f0 = (ulong *)*plVar3;
  }
  local_1e8 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  uVar6 = 0xf;
  if (local_1f0 != &local_1e0) {
    uVar6 = local_1e0;
  }
  if (uVar6 < (ulong)(local_1c8 + local_1e8)) {
    uVar6 = 0xf;
    if (local_1d0 != local_1c0) {
      uVar6 = local_1c0[0];
    }
    if ((ulong)(local_1c8 + local_1e8) <= uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_1f0);
      goto LAB_017ff74e;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_1d0);
LAB_017ff74e:
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar2;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*puVar4;
    (in_RDI->field_2)._M_allocated_capacity = *psVar1;
  }
  in_RDI->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,CONCAT71(uStack_19f,local_1a0) + 1);
  }
  return in_RDI;
}

Assistant:

string vecName (void) { return vecNamePrefix<T>() + "vec" + de::toString(Size); }